

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O1

BN * __thiscall BN::PowModBarrett(BN *__return_storage_ptr__,BN *this,BN *power,BN *mod)

{
  pointer puVar1;
  ushort uVar2;
  int iVar3;
  ushort uVar4;
  pointer puVar5;
  int iVar6;
  BN t;
  BN mu;
  BN local_a8;
  BN *local_88;
  int local_80;
  int local_7c;
  BN local_78;
  BN local_60;
  BN local_48;
  
  puVar1 = (power->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_88 = mod;
  if (((ulong)((long)(power->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) < 3) &&
     (*puVar1 == 0)) {
    bn1();
  }
  else {
    anon_unknown.dwarf_1091c::reductionBarrettPrecomputation(&local_48,mod);
    bn1();
    operator%(&local_78,this,mod);
    puVar1 = (power->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
             .super__Vector_impl_data._M_finish;
    uVar2 = puVar1[-1];
    if (uVar2 == 0) {
      iVar6 = -0x10;
    }
    else {
      uVar4 = 0xf;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      iVar6 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 0x10;
    }
    puVar5 = (power->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
             .super__Vector_impl_data._M_start;
    iVar3 = (int)puVar1;
    local_7c = iVar6 + (iVar3 - (int)puVar5) * 8;
    if (0 < local_7c) {
      local_80 = ~((int)puVar5 * 8) + iVar6 + iVar3 * 8;
      uVar2 = 1;
      iVar6 = 0;
      do {
        uVar4 = 1;
        if (1 < uVar2) {
          uVar4 = uVar2;
        }
        if ((puVar5[uVar2 == 0] & uVar4) != 0) {
          karatsubaMultiplication(&local_60,__return_storage_ptr__,&local_78);
          reductionBarrett(&local_a8,&local_60,local_88,&local_48);
          if (&local_a8 != __return_storage_ptr__) {
            puVar1 = (__return_storage_ptr__->ba).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start;
            (__return_storage_ptr__->ba).
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (__return_storage_ptr__->ba).
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (__return_storage_ptr__->ba).
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (puVar1 != (pointer)0x0) {
              operator_delete(puVar1);
            }
          }
          if (local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_80 != iVar6) {
          Qrt(&local_60,&local_78);
          reductionBarrett(&local_a8,&local_60,local_88,&local_48);
          puVar1 = local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (puVar1 != (pointer)0x0) {
            operator_delete(puVar1);
          }
          if (local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        puVar5 = puVar5 + (uVar2 == 0);
        iVar6 = iVar6 + 1;
        uVar2 = uVar4 * 2;
      } while (iVar6 < local_7c);
    }
    if (local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::PowModBarrett(const BN& power, const BN& mod) const {
    if(power.is0())
        return BN::bn1();

    BN mu = reductionBarrettPrecomputation(mod);
    BN res(BN::bn1());
    BN t = (*this) % mod;

    int len = power.bitCount();
    bt mask = 1;
    const bt *curr = &*power.ba.begin();
    for(int i = 0; i < len; i++) {
        if(!mask) {
            mask = 1;
            ++curr;
        }
        if( (*curr) & mask)
            res = (res*t).reductionBarrett(mod, mu);

        if (i + 1 != len)
            t = t.Qrt().reductionBarrett(mod, mu);
        mask <<= 1;
    }
    return res;
}